

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

void prvTidyCopyConfig(TidyDocImpl *docTo,TidyDocImpl *docFrom)

{
  Bool BVar1;
  undefined8 in_RAX;
  TidyOptionImpl *option;
  ulong uVar2;
  TidyOptionValue *new;
  TidyOptionValue *current;
  uint changedUserTags;
  undefined8 uStack_38;
  
  if (docTo != docFrom) {
    new = (docFrom->config).value;
    current = (docTo->config).value;
    uStack_38 = in_RAX;
    BVar1 = NeedReparseTagDecls(current,new,(uint *)((long)&uStack_38 + 4));
    prvTidyTakeConfigSnapshot(docTo);
    option = option_defs;
    for (uVar2 = 0; uVar2 != 0x60; uVar2 = uVar2 + 1) {
      if (uVar2 != option->id) {
        __assert_fail("ixVal == (uint) option->id",
                      "/workspace/llm4binary/github/license_c_cmakelists/lovasoa[P]tidy-html5/src/config.c"
                      ,0x244,"void prvTidyCopyConfig(TidyDocImpl *, TidyDocImpl *)");
      }
      CopyOptionValue(docTo,option,current,new);
      option = option + 1;
      current = current + 1;
      new = new + 1;
    }
    if (BVar1 != no) {
      ReparseTagDecls(docTo,uStack_38._4_4_);
    }
    AdjustConfig(docTo);
  }
  return;
}

Assistant:

void TY_(CopyConfig)( TidyDocImpl* docTo, TidyDocImpl* docFrom )
{
    if ( docTo != docFrom )
    {
        uint ixVal;
        const TidyOptionImpl* option = option_defs;
        const TidyOptionValue* from = &docFrom->config.value[ 0 ];
        TidyOptionValue* to   = &docTo->config.value[ 0 ];
        uint changedUserTags;
        Bool needReparseTagsDecls = NeedReparseTagDecls( to, from,
                                                         &changedUserTags );

        TY_(TakeConfigSnapshot)( docTo );
        for ( ixVal=0; ixVal < N_TIDY_OPTIONS; ++option, ++ixVal )
        {
            assert( ixVal == (uint) option->id );
            CopyOptionValue( docTo, option, &to[ixVal], &from[ixVal] );
        }
        if ( needReparseTagsDecls )
            ReparseTagDecls( docTo, changedUserTags  );
        AdjustConfig( docTo );  /* Make sure it's consistent */
    }
}